

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O0

void __thiscall TCPServer::on_input(TCPServer *this,Poll *p)

{
  int iVar1;
  ostream *poVar2;
  element_type *peVar3;
  string *psVar4;
  int *piVar5;
  sockaddr_in __args_2;
  shared_ptr<Subscriber> local_78 [2];
  uchar local_58 [8];
  undefined1 local_40 [8];
  shared_ptr<Subscriber> session;
  socklen_t client_len;
  sockaddr_in client;
  int connected_fd;
  Poll *p_local;
  TCPServer *this_local;
  
  while( true ) {
    session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         0x10;
    iVar1 = Subscriber::get_fd(&this->super_Subscriber);
    iVar1 = accept(iVar1,(sockaddr *)
                         ((long)&session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 4),
                   (socklen_t *)
                   &session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (iVar1 < 1) break;
    local_58[0] = session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._4_1_;
    local_58[1] = session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._5_1_;
    local_58[2] = session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._6_1_;
    local_58[3] = session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._7_1_;
    local_58[4] = (uchar)client_len;
    local_58[5] = client_len._1_1_;
    local_58[6] = client_len._2_1_;
    local_58[7] = client_len._3_1_;
    __args_2.sin_zero[0] =
         session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_;
    __args_2.sin_zero[1] =
         session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_;
    __args_2.sin_zero[2] =
         session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_;
    __args_2.sin_zero[3] =
         session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_;
    __args_2.sin_zero[4] = (uchar)client_len;
    __args_2.sin_zero[5] = client_len._1_1_;
    __args_2.sin_zero[6] = client_len._2_1_;
    __args_2.sin_zero[7] = client_len._3_1_;
    __args_2._0_8_ = this;
    std::function<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in)>::operator()
              ((function<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in)> *)local_40,
               (Poll *)&this->client_factory,(TCPServer *)p,__args_2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Started new tcp session ");
    peVar3 = std::__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_40);
    psVar4 = Subscriber::get_name_abi_cxx11_(peVar3);
    poVar2 = std::operator<<(poVar2,(string *)psVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    peVar3 = std::__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_40);
    Subscriber::set_fd(peVar3,iVar1);
    std::shared_ptr<Subscriber>::shared_ptr(local_78,(shared_ptr<Subscriber> *)local_40);
    Poll::subscribe(p,local_78);
    std::shared_ptr<Subscriber>::~shared_ptr(local_78);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&(this->super_Subscriber).name);
    poVar2 = std::operator<<(poVar2,": new connection");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::shared_ptr<Subscriber>::~shared_ptr((shared_ptr<Subscriber> *)local_40);
  }
  if ((iVar1 < 0) && (piVar5 = __errno_location(), *piVar5 != 0xb)) {
    no_err(-1,"accept failed");
  }
  return;
}

Assistant:

void TCPServer::on_input(Poll &p) {
  int connected_fd;
  do {
    struct sockaddr_in client;
    socklen_t client_len = sizeof(client);
    connected_fd = accept(this->get_fd(), (struct sockaddr *) &client, &client_len);
    if (connected_fd > 0) {
      std::shared_ptr<Subscriber> session = client_factory(p, *this, client);
      std::cout << "Started new tcp session " << session->get_name() << std::endl;
      session->set_fd(connected_fd);
      p.subscribe(session);
      std::cout << this->name << ": new connection" << std::endl;
    }
  } while (connected_fd > 0);
  if (connected_fd < 0 && errno != EWOULDBLOCK) {
    no_err(-1, "accept failed");
  }
}